

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable_const_iterator<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
::advance_past_empty_and_deleted
          (dense_hashtable_const_iterator<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
           *this)

{
  int iVar1;
  dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  *pdVar2;
  int *piVar3;
  
  piVar3 = this->pos;
  if (piVar3 != this->end) {
    pdVar2 = this->ht;
    iVar1 = (pdVar2->key_info).empty_key;
    do {
      if (iVar1 != *piVar3) {
        if (pdVar2->num_deleted == 0) {
          return;
        }
        if ((pdVar2->key_info).delkey != *piVar3) {
          return;
        }
      }
      piVar3 = piVar3 + 1;
      this->pos = piVar3;
    } while (piVar3 != this->end);
  }
  return;
}

Assistant:

void advance_past_empty_and_deleted() {
    while (pos != end && (ht->test_empty(*this) || ht->test_deleted(*this)))
      ++pos;
  }